

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::HandleInitExpr(BinaryReaderObjdump *this,InitExpr *expr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Enum extraout_EAX;
  Enum extraout_EAX_00;
  Enum extraout_EAX_01;
  Enum extraout_EAX_02;
  Enum EVar3;
  Enum extraout_EAX_03;
  Enum extraout_EAX_04;
  Index IVar4;
  char *pcVar5;
  ObjdumpNames *this_00;
  string_view sVar6;
  char acStack_38 [40];
  
  if (this->in_data_section_ == true) {
    *(undefined8 *)((long)&(this->data_init_expr_).value + 8) =
         *(undefined8 *)((long)&expr->value + 8);
    uVar1 = *(undefined4 *)&expr->field_0x4;
    IVar4 = (expr->value).index;
    uVar2 = *(undefined4 *)((long)&expr->value + 4);
    (this->data_init_expr_).type = expr->type;
    *(undefined4 *)&(this->data_init_expr_).field_0x4 = uVar1;
    (this->data_init_expr_).value.index = IVar4;
    *(undefined4 *)((long)&(this->data_init_expr_).value + 4) = uVar2;
    EVar3 = expr->type;
    if (EVar3 < 8) {
      if ((0xdeU >> (EVar3 & 0x1f) & 1) != 0) goto LAB_0012ab08;
      if (EVar3 == Ok) {
        EVar3 = (expr->value).type.enum_;
        this->data_offset_ = EVar3;
        return (Result)EVar3;
      }
      this->data_offset_ = 0;
    }
    return (Result)EVar3;
  }
  if (this->in_elem_section_ == true) {
    *(undefined8 *)((long)&(this->elem_init_expr_).value + 8) =
         *(undefined8 *)((long)&expr->value + 8);
    uVar1 = *(undefined4 *)&expr->field_0x4;
    IVar4 = (expr->value).index;
    uVar2 = *(undefined4 *)((long)&expr->value + 4);
    (this->elem_init_expr_).type = expr->type;
    *(undefined4 *)&(this->elem_init_expr_).field_0x4 = uVar1;
    (this->elem_init_expr_).value.index = IVar4;
    *(undefined4 *)((long)&(this->elem_init_expr_).value + 4) = uVar2;
    EVar3 = expr->type;
    if (7 < EVar3) {
      return (Result)EVar3;
    }
    if ((0xdeU >> (EVar3 & 0x1f) & 1) == 0) {
      if (EVar3 == Ok) {
        EVar3 = (expr->value).type.enum_;
        this->elem_offset_ = EVar3;
        return (Result)EVar3;
      }
      this->elem_offset_ = 0;
      return (Result)EVar3;
    }
LAB_0012ab08:
    Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                   "Segment/Elem offset must be an i32 init expr");
    return (Result)extraout_EAX_04;
  }
  EVar3 = expr->type;
  switch(EVar3) {
  case Ok:
    PrintDetails(this," - init i32=%d\n",(ulong)(expr->value).index);
    return (Result)extraout_EAX;
  case Error:
    WriteFloatHex(acStack_38,0x14,(expr->value).i32);
    pcVar5 = " - init f32=%s\n";
    break;
  case 2:
    PrintDetails(this," - init i64=%ld\n",(expr->value).i64);
    return (Result)extraout_EAX_01;
  case 3:
    WriteDoubleHex(acStack_38,0x28,(expr->value).i64);
    pcVar5 = " - init f64=%s\n";
    break;
  case 4:
    PrintDetails(this," - init v128=0x%08x 0x%08x 0x%08x 0x%08x \n",(ulong)(expr->value).index,
                 (ulong)*(uint *)((long)&expr->value + 4),(ulong)*(uint *)((long)&expr->value + 8),
                 (ulong)*(uint *)((long)&expr->value + 0xc));
    return (Result)extraout_EAX_00;
  case 5:
    PrintDetails(this," - init global=%u",(ulong)(expr->value).index);
    IVar4 = (expr->value).index;
    this_00 = &((this->super_BinaryReaderObjdumpBase).objdump_state_)->global_names;
    goto LAB_0012a982;
  case 6:
    PrintDetails(this," - init ref.func:%u",(ulong)(expr->value).index);
    IVar4 = (expr->value).index;
    this_00 = &((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_names;
LAB_0012a982:
    sVar6 = ObjdumpNames::Get(this_00,IVar4);
    if (sVar6.size_ != 0) {
      PrintDetails(this," <%.*s>",sVar6.size_,sVar6.data_);
    }
    pcVar5 = "\n";
LAB_0012a9a7:
    PrintDetails(this,pcVar5);
    return (Result)extraout_EAX_03;
  case 7:
    pcVar5 = " - init null\n";
    goto LAB_0012a9a7;
  default:
    goto switchD_0012a883_default;
  }
  PrintDetails(this,pcVar5,acStack_38);
  EVar3 = extraout_EAX_02;
switchD_0012a883_default:
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderObjdump::HandleInitExpr(const InitExpr& expr) {
  if (in_data_section_) {
    data_init_expr_ = expr;
    return InitExprToConstOffset(expr, &data_offset_);
  } else if (in_elem_section_) {
    elem_init_expr_ = expr;
    return InitExprToConstOffset(expr, &elem_offset_);
  } else {
    PrintInitExpr(expr);
  }
  return Result::Ok;
}